

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceArguments.cpp
# Opt level: O2

JavascriptString *
Js::StackTraceArguments::TypeCodeToTypeName(uint typeCode,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  
  switch(typeCode) {
  case 0:
    pJVar4 = StringCache::GetNullDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 1:
    pJVar4 = StringCache::GetUndefinedDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 2:
    pJVar4 = StringCache::GetBooleanTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 3:
    pJVar4 = StringCache::GetStringTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 4:
    pJVar4 = StringCache::GetNaNDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 5:
    pJVar4 = StringCache::GetNumberTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 6:
    pJVar4 = StringCache::GetSymbolTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  case 7:
    pJVar4 = StringCache::GetObjectTypeDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
    return pJVar4;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/StackTraceArguments.cpp"
                              ,0x3d,"(0)","Unknown type code");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
  pJVar4 = JavascriptLibrary::GetEmptyString
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  return pJVar4;
}

Assistant:

JavascriptString *StackTraceArguments::TypeCodeToTypeName(unsigned typeCode, ScriptContext *scriptContext)
    {
        switch(typeCode)
        {
            case nullValue:
                return scriptContext->GetLibrary()->GetNullDisplayString();
            case undefinedValue:
                return scriptContext->GetLibrary()->GetUndefinedDisplayString();
            case booleanValue:
                return scriptContext->GetLibrary()->GetBooleanTypeDisplayString();
            case stringValue:
                return scriptContext->GetLibrary()->GetStringTypeDisplayString();
            case nanValue:
                return scriptContext->GetLibrary()->GetNaNDisplayString();
            case numberValue:
                return scriptContext->GetLibrary()->GetNumberTypeDisplayString();
            case symbolValue:
                return scriptContext->GetLibrary()->GetSymbolTypeDisplayString();
            case objectValue:
                return scriptContext->GetLibrary()->GetObjectTypeDisplayString();
            default:
              AssertMsg(0, "Unknown type code");
              return scriptContext->GetLibrary()->GetEmptyString();
        }
    }